

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

Environment * __thiscall testing::UnitTest::AddEnvironment(UnitTest *this,Environment *env)

{
  Environment *pEVar1;
  long in_FS_OFFSET;
  Environment *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = env;
  if (env == (Environment *)0x0) {
    pEVar1 = (Environment *)0x0;
  }
  else {
    std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::push_back
              (&this->impl_->environments_,&local_18);
    pEVar1 = local_18;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return pEVar1;
  }
  __stack_chk_fail();
}

Assistant:

Environment* UnitTest::AddEnvironment(Environment* env) {
  if (env == NULL) {
    return NULL;
  }

  impl_->environments().push_back(env);
  return env;
}